

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::detectPrimaryPicType(H264StreamReader *this,SliceUnit *firstSlice,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int local_d4;
  uint local_d0;
  undefined4 local_cc;
  int nalUnitType;
  uint8_t *nextSlice;
  int local_ac;
  undefined1 local_a8 [8];
  SliceUnit slice;
  uint8_t *buff_local;
  SliceUnit *firstSlice_local;
  H264StreamReader *this_local;
  
  slice.sps = (SPSUnit *)buff;
  SliceUnit::SliceUnit((SliceUnit *)local_a8);
  (this->super_MPEGStreamReader).field_0xda = 0;
  (this->super_MPEGStreamReader).field_0xdb = 0;
  this->m_pict_type = -1;
  local_ac = sliceTypeToPictType(this,firstSlice->slice_type);
  piVar3 = std::max<int>(&this->m_pict_type,&local_ac);
  this->m_pict_type = *piVar3;
  _nalUnitType = NALUnit::findNextNAL
                           ((uint8_t *)slice.sps,
                            (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  if (_nalUnitType == (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
    this_local._4_4_ = -10;
    if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
      this_local._4_4_ = 0;
    }
  }
  else {
    do {
      local_d0 = (uint)*_nalUnitType;
      if (((local_d0 & 0x1f) - 1 < 5) || ((local_d0 & 0x1f) == 0x14)) {
        iVar2 = SliceUnit::deserializeSliceType
                          ((SliceUnit *)local_a8,_nalUnitType,
                           (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
        if (iVar2 != 0) {
          this_local._4_4_ = -10;
          if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
            this_local._4_4_ = 0;
          }
          goto LAB_0029e8fd;
        }
        if (slice.non_idr_flag == 0) {
          (this->super_MPEGStreamReader).field_0xda = 1;
          bVar1 = SliceUnit::isIDR((SliceUnit *)local_a8);
          (this->super_MPEGStreamReader).field_0xdb = bVar1;
          this_local._4_4_ = 0;
          goto LAB_0029e8fd;
        }
        local_d4 = sliceTypeToPictType(this,slice.memory_management_control_operation);
        piVar3 = std::max<int>(&this->m_pict_type,&local_d4);
        this->m_pict_type = *piVar3;
      }
      _nalUnitType = NALUnit::findNextNAL
                               (_nalUnitType,
                                (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    } while (_nalUnitType != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    this_local._4_4_ = -10;
    if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
      this_local._4_4_ = 0;
    }
  }
LAB_0029e8fd:
  local_cc = 1;
  SliceUnit::~SliceUnit((SliceUnit *)local_a8);
  return this_local._4_4_;
}

Assistant:

int H264StreamReader::detectPrimaryPicType(const SliceUnit &firstSlice, uint8_t *buff)
{
    SliceUnit slice;
    m_nextFrameFound = false;
    m_nextFrameIdr = false;
    m_pict_type = -1;
    m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(firstSlice.slice_type));

    uint8_t *nextSlice = NALUnit::findNextNAL(buff, m_bufEnd);
    if (nextSlice == m_bufEnd)
    {
        return m_eof ? 0 : NOT_ENOUGH_BUFFER;
    }

    while (true)
    {
        const int nalUnitType = *nextSlice;
        switch (static_cast<NALUnit::NALType>(nalUnitType & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (slice.deserializeSliceType(nextSlice, m_bufEnd) != 0)
            {
                return m_eof ? 0 : NOT_ENOUGH_BUFFER;
            }

            if (slice.first_mb_in_slice == 0)
            {
                m_nextFrameFound = true;
                m_nextFrameIdr = slice.isIDR();
                return 0;  // next frame found
            }
            m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(slice.slice_type));
            break;
        default:
            break;
        }
        nextSlice = NALUnit::findNextNAL(nextSlice, m_bufEnd);
        if (nextSlice == m_bufEnd)
        {
            return m_eof ? 0 : NOT_ENOUGH_BUFFER;
        }
    }
}